

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::setPose(btSoftBody *this,bool bvolume,bool bframe)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  float *ptr;
  btVector3 *ptr_00;
  Node *pNVar4;
  undefined1 auVar5 [16];
  btMatrix3x3 *pbVar6;
  uint uVar7;
  float *pfVar8;
  btVector3 *pbVar9;
  ulong uVar10;
  long lVar11;
  btScalar *pbVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  btScalar bVar17;
  btScalar bVar18;
  float fVar19;
  float fVar20;
  btScalar bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btVector3 bVar29;
  
  (this->m_pose).m_bvolume = bvolume;
  (this->m_pose).m_bframe = bframe;
  uVar15 = (this->m_nodes).m_size;
  lVar13 = (long)(int)uVar15;
  if (lVar13 < 1) {
    fVar24 = 0.0;
  }
  else {
    fVar24 = 0.0;
    lVar11 = 0;
    do {
      fVar16 = *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar11);
      fVar24 = fVar24 + (float)(-(uint)(0.0 < fVar16) & (uint)(1.0 / fVar16));
      lVar11 = lVar11 + 0x78;
    } while (lVar13 * 0x78 - lVar11 != 0);
  }
  uVar7 = (this->m_pose).m_wgh.m_size;
  uVar14 = uVar15;
  if ((int)uVar15 <= (int)uVar7) goto LAB_001d709a;
  lVar11 = (long)(int)uVar7;
  if ((this->m_pose).m_wgh.m_capacity < (int)uVar15) {
    if (uVar15 == 0) {
      pfVar8 = (float *)0x0;
    }
    else {
      pfVar8 = (float *)btAlignedAllocInternal(lVar13 * 4,0x10);
      uVar7 = (this->m_pose).m_wgh.m_size;
    }
    ptr = (this->m_pose).m_wgh.m_data;
    if ((int)uVar7 < 1) {
      if (ptr != (float *)0x0) goto LAB_001d7057;
    }
    else {
      uVar10 = 0;
      do {
        pfVar8[uVar10] = ptr[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
LAB_001d7057:
      if ((this->m_pose).m_wgh.m_ownsMemory == true) {
        btAlignedFreeInternal(ptr);
      }
    }
    (this->m_pose).m_wgh.m_ownsMemory = true;
    (this->m_pose).m_wgh.m_data = pfVar8;
    (this->m_pose).m_wgh.m_capacity = uVar15;
  }
  else {
    pfVar8 = (this->m_pose).m_wgh.m_data;
  }
  memset(pfVar8 + lVar11,0,(lVar13 - lVar11) * 4);
  uVar14 = (this->m_nodes).m_size;
LAB_001d709a:
  (this->m_pose).m_wgh.m_size = uVar15;
  if (0 < (int)uVar14) {
    fVar16 = (float)(int)uVar15 * fVar24 * 1000.0;
    lVar13 = 0;
    do {
      uVar15 = -(uint)(0.0 < *(float *)((long)(&((this->m_nodes).m_data)->m_n + 1) + lVar13));
      fVar24 = (float)(uVar15 & (uint)fVar24 | ~uVar15 & (uint)(fVar16 + fVar24));
      lVar13 = lVar13 + 0x78;
    } while ((ulong)uVar14 * 0x78 - lVar13 != 0);
    if (0 < (int)uVar14) {
      pfVar8 = (this->m_pose).m_wgh.m_data;
      pbVar12 = &((this->m_nodes).m_data)->m_im;
      uVar10 = 0;
      do {
        uVar15 = -(uint)(0.0 < *pbVar12);
        pfVar8[uVar10] =
             (float)(~uVar15 & (uint)(fVar16 / fVar24) | (uint)(1.0 / (fVar24 * *pbVar12)) & uVar15)
        ;
        uVar10 = uVar10 + 1;
        pbVar12 = pbVar12 + 0x1e;
      } while (uVar14 != uVar10);
    }
  }
  bVar29 = evaluateCom(this);
  uVar15 = (this->m_pose).m_pos.m_size;
  uVar7 = uVar14;
  if ((int)uVar15 < (int)uVar14) {
    if ((this->m_pose).m_pos.m_capacity < (int)uVar14) {
      if (uVar14 == 0) {
        pbVar9 = (btVector3 *)0x0;
      }
      else {
        pbVar9 = (btVector3 *)btAlignedAllocInternal((long)(int)uVar14 << 4,0x10);
        uVar15 = (this->m_pose).m_pos.m_size;
      }
      if (0 < (int)uVar15) {
        lVar13 = 0;
        do {
          puVar1 = (undefined8 *)((long)((this->m_pose).m_pos.m_data)->m_floats + lVar13);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)((long)pbVar9->m_floats + lVar13);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          lVar13 = lVar13 + 0x10;
        } while ((ulong)uVar15 << 4 != lVar13);
      }
      ptr_00 = (this->m_pose).m_pos.m_data;
      if ((ptr_00 != (btVector3 *)0x0) && ((this->m_pose).m_pos.m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr_00);
      }
      (this->m_pose).m_pos.m_ownsMemory = true;
      (this->m_pose).m_pos.m_data = pbVar9;
      (this->m_pose).m_pos.m_capacity = uVar14;
    }
    uVar7 = (this->m_nodes).m_size;
  }
  (this->m_pose).m_pos.m_size = uVar14;
  if (0 < (int)uVar7) {
    lVar13 = 0x18;
    lVar11 = 0;
    do {
      pNVar4 = (this->m_nodes).m_data;
      uVar3 = *(undefined8 *)((long)(pNVar4->m_x).m_floats + lVar13 + -0x18);
      auVar5._4_4_ = (float)((ulong)uVar3 >> 0x20) - bVar29.m_floats[1];
      auVar5._0_4_ = (float)uVar3 - bVar29.m_floats[0];
      auVar5._8_4_ = *(float *)((long)&(((Node *)(&pNVar4->m_x + -1))->super_Feature).super_Element.
                                       m_tag + lVar13) - bVar29.m_floats[2];
      auVar5._12_4_ = 0;
      *(undefined1 (*) [16])((long)((this->m_pose).m_pos.m_data)->m_floats + lVar11) = auVar5;
      lVar11 = lVar11 + 0x10;
      lVar13 = lVar13 + 0x78;
    } while ((ulong)uVar7 << 4 != lVar11);
  }
  bVar17 = 0.0;
  if (bvolume) {
    bVar17 = getVolume(this);
  }
  (this->m_pose).m_volume = bVar17;
  (this->m_pose).m_com.m_floats[0] = bVar29.m_floats[0];
  (this->m_pose).m_com.m_floats[1] = bVar29.m_floats[1];
  (this->m_pose).m_com.m_floats[2] = bVar29.m_floats[2];
  (this->m_pose).m_com.m_floats[3] = bVar29.m_floats[3];
  (this->m_pose).m_rot.m_el[0].m_floats[0] = 1.0;
  fVar24 = 0.0;
  fVar16 = 0.0;
  pbVar6 = &(this->m_pose).m_rot;
  pbVar6->m_el[0].m_floats[1] = 0.0;
  pbVar6->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_rot.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_rot.m_el[1].m_floats[1] = 1.0;
  pbVar9 = (this->m_pose).m_rot.m_el;
  pbVar9[1].m_floats[2] = 0.0;
  pbVar9[1].m_floats[3] = 0.0;
  pbVar6 = &(this->m_pose).m_rot;
  pbVar6->m_el[2].m_floats[0] = 0.0;
  pbVar6->m_el[2].m_floats[1] = 0.0;
  pbVar9 = (this->m_pose).m_rot.m_el;
  pbVar9[2].m_floats[2] = 1.0;
  pbVar9[2].m_floats[3] = 0.0;
  (this->m_pose).m_scl.m_el[0].m_floats[0] = 1.0;
  pbVar6 = &(this->m_pose).m_scl;
  pbVar6->m_el[0].m_floats[1] = 0.0;
  pbVar6->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_scl.m_el[0].m_floats + 3) = 0;
  (this->m_pose).m_scl.m_el[1].m_floats[1] = 1.0;
  pbVar9 = (this->m_pose).m_scl.m_el;
  pbVar9[1].m_floats[2] = 0.0;
  pbVar9[1].m_floats[3] = 0.0;
  pbVar6 = &(this->m_pose).m_scl;
  pbVar6->m_el[2].m_floats[0] = 0.0;
  pbVar6->m_el[2].m_floats[1] = 0.0;
  (this->m_pose).m_scl.m_el[2].m_floats[2] = 1.0;
  *(undefined8 *)((this->m_pose).m_scl.m_el[2].m_floats + 3) = 0;
  pbVar6 = &(this->m_pose).m_aqq;
  pbVar6->m_el[0].m_floats[1] = 0.0;
  pbVar6->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[0].m_floats + 3) = 0;
  pbVar9 = (this->m_pose).m_aqq.m_el;
  pbVar9[1].m_floats[1] = 0.0;
  pbVar9[1].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_pose).m_aqq.m_el[1].m_floats + 3) = 0;
  pbVar9 = (this->m_pose).m_aqq.m_el;
  pbVar9[2].m_floats[1] = 0.0;
  pbVar9[2].m_floats[2] = 0.0;
  (this->m_pose).m_aqq.m_el[2].m_floats[3] = 0.0;
  lVar13 = (long)(this->m_nodes).m_size;
  if (lVar13 < 1) {
    uVar10 = (ulong)(uint)(this->m_pose).m_aqq.m_el[1].m_floats[0];
    bVar18 = (this->m_pose).m_aqq.m_el[0].m_floats[0];
    fVar19 = (this->m_pose).m_aqq.m_el[0].m_floats[1];
    bVar17 = (this->m_pose).m_aqq.m_el[0].m_floats[2];
    bVar21 = (this->m_pose).m_aqq.m_el[1].m_floats[1];
    fVar22 = (this->m_pose).m_aqq.m_el[1].m_floats[2];
    fVar23 = 0.0;
  }
  else {
    pbVar9 = (this->m_pose).m_pos.m_data;
    pfVar8 = (this->m_pose).m_wgh.m_data;
    bVar18 = (this->m_pose).m_aqq.m_el[0].m_floats[0];
    fVar19 = (this->m_pose).m_aqq.m_el[0].m_floats[1];
    bVar17 = (this->m_pose).m_aqq.m_el[0].m_floats[2];
    uVar10 = *(ulong *)(this->m_pose).m_aqq.m_el[1].m_floats;
    fVar22 = (this->m_pose).m_aqq.m_el[1].m_floats[2];
    fVar23 = 0.0;
    lVar11 = 0;
    do {
      fVar25 = *(float *)((long)pfVar8 + lVar11);
      fVar20 = (float)*(undefined8 *)(pbVar9->m_floats + lVar11);
      fVar26 = (float)((ulong)*(undefined8 *)(pbVar9->m_floats + lVar11) >> 0x20);
      fVar28 = fVar20 * fVar25;
      fVar27 = fVar26 * fVar25;
      fVar25 = fVar25 * pbVar9->m_floats[lVar11 + 2];
      bVar18 = bVar18 + fVar28 * fVar20;
      fVar19 = fVar19 + fVar28 * fVar26;
      bVar17 = bVar17 + fVar28 * pbVar9->m_floats[lVar11 + 2];
      (this->m_pose).m_aqq.m_el[0].m_floats[2] = bVar17;
      (this->m_pose).m_aqq.m_el[0].m_floats[0] = bVar18;
      (this->m_pose).m_aqq.m_el[0].m_floats[1] = fVar19;
      fVar20 = pbVar9->m_floats[lVar11 + 2];
      bVar21 = (float)(uVar10 >> 0x20) +
               fVar27 * (float)((ulong)*(undefined8 *)(pbVar9->m_floats + lVar11) >> 0x20);
      uVar10 = CONCAT44(bVar21,(float)uVar10 +
                               fVar27 * (float)*(undefined8 *)(pbVar9->m_floats + lVar11));
      *(ulong *)(this->m_pose).m_aqq.m_el[1].m_floats = uVar10;
      fVar22 = fVar22 + fVar20 * fVar27;
      (this->m_pose).m_aqq.m_el[1].m_floats[2] = fVar22;
      fVar23 = fVar23 + pbVar9->m_floats[lVar11] * fVar25;
      fVar24 = fVar24 + fVar25 * (float)*(undefined8 *)(pbVar9->m_floats + lVar11 + 1);
      fVar16 = fVar16 + fVar25 * (float)((ulong)*(undefined8 *)(pbVar9->m_floats + lVar11 + 1) >>
                                        0x20);
      (this->m_pose).m_aqq.m_el[2].m_floats[0] = fVar23;
      *(ulong *)((this->m_pose).m_aqq.m_el[2].m_floats + 1) = CONCAT44(fVar16,fVar24);
      lVar11 = lVar11 + 4;
    } while (lVar13 * 4 != lVar11);
  }
  fVar20 = (float)uVar10;
  fVar26 = fVar22 * fVar23 - fVar16 * fVar20;
  fVar28 = fVar20 * fVar24 - fVar23 * bVar21;
  fVar27 = bVar21 * fVar16 - fVar24 * fVar22;
  fVar25 = 1.0 / (bVar17 * fVar28 + fVar27 * bVar18 + fVar19 * fVar26);
  *(ulong *)(this->m_pose).m_aqq.m_el[0].m_floats =
       CONCAT44((bVar17 * fVar24 - fVar16 * fVar19) * fVar25,fVar27 * fVar25);
  (this->m_pose).m_aqq.m_el[0].m_floats[2] = (fVar19 * fVar22 - bVar21 * bVar17) * fVar25;
  (this->m_pose).m_aqq.m_el[0].m_floats[3] = 0.0;
  (this->m_pose).m_aqq.m_el[1].m_floats[0] = fVar26 * fVar25;
  (this->m_pose).m_aqq.m_el[1].m_floats[1] = (fVar16 * bVar18 - fVar23 * bVar17) * fVar25;
  (this->m_pose).m_aqq.m_el[1].m_floats[2] = (bVar17 * fVar20 - fVar22 * bVar18) * fVar25;
  (this->m_pose).m_aqq.m_el[1].m_floats[3] = 0.0;
  (this->m_pose).m_aqq.m_el[2].m_floats[0] = fVar28 * fVar25;
  (this->m_pose).m_aqq.m_el[2].m_floats[1] = (fVar19 * fVar23 - fVar24 * bVar18) * fVar25;
  (this->m_pose).m_aqq.m_el[2].m_floats[2] = fVar25 * (bVar21 * bVar18 + -fVar19 * fVar20);
  (this->m_pose).m_aqq.m_el[2].m_floats[3] = 0.0;
  updateConstants(this);
  return;
}

Assistant:

void			btSoftBody::setPose(bool bvolume,bool bframe)
{
	m_pose.m_bvolume	=	bvolume;
	m_pose.m_bframe		=	bframe;
	int i,ni;

	/* Weights		*/ 
	const btScalar	omass=getTotalMass();
	const btScalar	kmass=omass*m_nodes.size()*1000;
	btScalar		tmass=omass;
	m_pose.m_wgh.resize(m_nodes.size());
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		if(m_nodes[i].m_im<=0) tmass+=kmass;
	}
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		Node&	n=m_nodes[i];
		m_pose.m_wgh[i]=	n.m_im>0					?
			1/(m_nodes[i].m_im*tmass)	:
		kmass/tmass;
	}
	/* Pos		*/ 
	const btVector3	com=evaluateCom();
	m_pose.m_pos.resize(m_nodes.size());
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_pose.m_pos[i]=m_nodes[i].m_x-com;
	}
	m_pose.m_volume	=	bvolume?getVolume():0;
	m_pose.m_com	=	com;
	m_pose.m_rot.setIdentity();
	m_pose.m_scl.setIdentity();
	/* Aqq		*/ 
	m_pose.m_aqq[0]	=
		m_pose.m_aqq[1]	=
		m_pose.m_aqq[2]	=	btVector3(0,0,0);
	for( i=0,ni=m_nodes.size();i<ni;++i)
	{
		const btVector3&	q=m_pose.m_pos[i];
		const btVector3		mq=m_pose.m_wgh[i]*q;
		m_pose.m_aqq[0]+=mq.x()*q;
		m_pose.m_aqq[1]+=mq.y()*q;
		m_pose.m_aqq[2]+=mq.z()*q;
	}
	m_pose.m_aqq=m_pose.m_aqq.inverse();
	
	updateConstants();
}